

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::logAndSetTestResult
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration> *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
          *results)

{
  TestContext *this_00;
  deUint64 dVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong __n;
  RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration> *pRVar8;
  long lVar9;
  long lVar11;
  int precision;
  allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>
  *extraout_RDX;
  size_t __n_00;
  pointer pSVar12;
  pointer pRVar13;
  RenderSampleAnalyzeResult RVar14;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  mappedResults;
  string local_50;
  pointer pSVar10;
  
  mappedResults.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mappedResults.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mappedResults.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar12 = (results->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (results->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  __n = ((long)pSVar10 - (long)pSVar12) / 0x48;
  if (pSVar10 != pSVar12) {
    if (0x249249249249249 < __n) {
      std::__throw_length_error("vector::_M_default_append");
    }
    pRVar8 = (RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
              *)operator_new(__n * 0x38);
    std::
    __uninitialized_default_n_a<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>*,unsigned_long,deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
              (pRVar8,__n,extraout_RDX);
    std::
    _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
    ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                     *)0x0,(pointer)0x0,__n_00);
    mappedResults.
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar8 + __n;
    pSVar12 = (results->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar10 = (results->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    mappedResults.
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pRVar8;
  }
  lVar9 = (long)pSVar10 - (long)pSVar12;
  pRVar13 = mappedResults.
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (lVar11 = 0; pRVar8 = &pSVar12->result, lVar11 < (int)(lVar9 / 0x48); lVar11 = lVar11 + 1) {
    (pRVar13->duration).fitResponseDuration = (pRVar8->duration).fitResponseDuration;
    iVar4 = pRVar8->uploadedDataSize;
    iVar5 = pRVar8->renderDataSize;
    iVar6 = pRVar8->unrelatedDataSize;
    iVar7 = pRVar8->numVertices;
    dVar1 = (pRVar8->duration).renderDuration;
    dVar2 = (pRVar8->duration).readDuration;
    dVar3 = (pRVar8->duration).totalDuration;
    (pRVar13->duration).renderReadDuration = (pRVar8->duration).renderReadDuration;
    (pRVar13->duration).totalDuration = dVar3;
    (pRVar13->duration).renderDuration = dVar1;
    (pRVar13->duration).readDuration = dVar2;
    pRVar13->uploadedDataSize = iVar4;
    pRVar13->renderDataSize = iVar5;
    pRVar13->unrelatedDataSize = iVar6;
    pRVar13->numVertices = iVar7;
    pRVar13 = pRVar13 + 1;
    pSVar12 = (pointer)(pRVar8 + 1);
  }
  mappedResults.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       mappedResults.
       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  RVar14 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                     (((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log,&mappedResults);
  this_00 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  if (RVar14.renderRateAtRange < INFINITY) {
    de::floatToString_abi_cxx11_
              (&local_50,(de *)0x2,RVar14.renderRateAtRange * 0.0009765625 * 0.0009765625,precision)
    ;
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_50._M_dataplus._M_p);
  }
  else {
    de::floatToString_abi_cxx11_(&local_50,(de *)0x2,0.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  ::~vector(&mappedResults);
  return;
}

Assistant:

void RenderCase<SampleType>::logAndSetTestResult (const std::vector<SampleResult>& results)
{
	std::vector<RenderSampleResult<SampleType> > mappedResults;

	mapResultsToRenderRateFormat(mappedResults, results);

	{
		const RenderSampleAnalyzeResult	analysis	= analyzeSampleResults(m_testCtx.getLog(), mappedResults);
		const float						rate		= analysis.renderRateAtRange;

		if (rate == std::numeric_limits<float>::infinity())
		{
			// sample times are 1) invalid or 2) timer resolution too low
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
		}
		else
		{
			// report transfer rate in millions of MiB/s
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(rate / 1024.0f / 1024.0f, 2).c_str());
		}
	}
}